

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

xmlAttrPtr
xmlSAX2AttributeNs(xmlParserCtxtPtr ctxt,xmlChar *localname,xmlChar *prefix,xmlChar *value,
                  xmlChar *valueend)

{
  xmlChar xVar1;
  _xmlNode *p_Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  xmlNodePtr node;
  xmlRegisterNodeFunc *pp_Var6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *name;
  xmlChar *pxVar9;
  int iVar10;
  xmlNsPtr namespace;
  xmlChar fn [50];
  
  namespace = (xmlNsPtr)0x0;
  if ((((prefix != (xmlChar *)0x0) &&
       (namespace = (xmlNsPtr)xmlParserNsLookupSax(ctxt,prefix), namespace == (xmlNsPtr)0x0)) &&
      (iVar3 = xmlStrEqual(prefix,(xmlChar *)"xml"), iVar3 != 0)) &&
     (iVar3 = xmlSearchNsSafe(ctxt->node,prefix,&namespace), iVar3 < 0)) {
    xmlCtxtErrMemory(ctxt);
  }
  node = (xmlNodePtr)ctxt->freeAttrs;
  if (node == (xmlNodePtr)0x0) {
    node = (xmlNodePtr)(*xmlMalloc)(0x68);
    if (node == (xmlNodePtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      return (xmlAttrPtr)0x0;
    }
  }
  else {
    ctxt->freeAttrs = (xmlAttrPtr)node->next;
    ctxt->freeAttrsNr = ctxt->freeAttrsNr + -1;
  }
  node->_private = (void *)0x0;
  *(undefined8 *)&node->type = 0;
  node->content = (xmlChar *)0x0;
  node->properties = (_xmlAttr *)0x0;
  node->doc = (_xmlDoc *)0x0;
  node->ns = (xmlNs *)0x0;
  node->next = (_xmlNode *)0x0;
  node->prev = (_xmlNode *)0x0;
  node->last = (_xmlNode *)0x0;
  node->parent = (_xmlNode *)0x0;
  node->name = (xmlChar *)0x0;
  node->children = (_xmlNode *)0x0;
  node->nsDef = (xmlNs *)0x0;
  node->type = XML_ATTRIBUTE_NODE;
  p_Var2 = ctxt->node;
  node->parent = p_Var2;
  node->doc = p_Var2->doc;
  node->ns = namespace;
  if (ctxt->dictNames == 0) {
    pxVar8 = xmlStrdup(localname);
    node->name = pxVar8;
    if (pxVar8 == (xmlChar *)0x0) {
      xmlCtxtErrMemory(ctxt);
    }
  }
  else {
    node->name = localname;
  }
  if ((xmlRegisterCallbacks != 0) &&
     (pp_Var6 = __xmlRegisterNodeDefaultValue(), *pp_Var6 != (xmlRegisterNodeFunc)0x0)) {
    pp_Var6 = __xmlRegisterNodeDefaultValue();
    (**pp_Var6)(node);
  }
  iVar3 = (int)valueend;
  iVar10 = (int)value;
  if ((ctxt->replaceEntities == 0) && (ctxt->html == 0)) {
    if (*valueend == '\0') {
      if ((value < valueend) && (iVar4 = xmlNodeParseContent(node,value,iVar3 - iVar10), iVar4 < 0))
      {
        xmlCtxtErrMemory(ctxt);
      }
    }
    else {
LAB_001463ab:
      pxVar7 = xmlSAX2TextNode(ctxt,value,iVar3 - iVar10);
      node->children = pxVar7;
      node->last = pxVar7;
      if (pxVar7 != (xmlNodePtr)0x0) {
        pxVar7->doc = node->doc;
        pxVar7->parent = node;
      }
    }
  }
  else if (value != (xmlChar *)0x0) goto LAB_001463ab;
  if ((((ctxt->html != 0) || (ctxt->validate == 0)) || (ctxt->wellFormed == 0)) ||
     ((ctxt->myDoc == (xmlDocPtr)0x0 || (ctxt->myDoc->intSubset == (_xmlDtd *)0x0)))) {
    if ((ctxt->loadsubset & 8) != 0) {
      return (xmlAttrPtr)node;
    }
    if (ctxt->input->entity != (xmlEntityPtr)0x0) {
      return (xmlAttrPtr)node;
    }
    p_Var2 = node->children;
    if (p_Var2 == (_xmlNode *)0x0) {
      return (xmlAttrPtr)node;
    }
    if (p_Var2->type == XML_TEXT_NODE) {
      if (p_Var2->next != (_xmlNode *)0x0) {
        return (xmlAttrPtr)node;
      }
      pxVar8 = p_Var2->content;
      if (((ctxt->str_xml == prefix) && (*localname == 'i')) &&
         ((localname[1] == 'd' && (localname[2] == '\0')))) {
        iVar3 = xmlValidateNCName(pxVar8,1);
        if (iVar3 != 0) {
          xmlErrValid(ctxt,XML_DTD_XMLID_VALUE,"xml:id : attribute value %s is not an NCName\n",
                      pxVar8,(xmlChar *)0x0);
        }
      }
      else {
        iVar3 = xmlIsID(ctxt->myDoc,ctxt->node,(xmlAttrPtr)node);
        if (iVar3 < 0) {
          xmlCtxtErrMemory(ctxt);
          return (xmlAttrPtr)node;
        }
        if (iVar3 == 0) {
          iVar3 = xmlIsRef(ctxt->myDoc,ctxt->node,(xmlAttrPtr)node);
          if (iVar3 == 0) {
            return (xmlAttrPtr)node;
          }
          xmlAddRef(&ctxt->vctxt,ctxt->myDoc,pxVar8,(xmlAttrPtr)node);
          return (xmlAttrPtr)node;
        }
      }
      xmlAddID(&ctxt->vctxt,ctxt->myDoc,pxVar8,(xmlAttrPtr)node);
      return (xmlAttrPtr)node;
    }
    return (xmlAttrPtr)node;
  }
  pxVar8 = value;
  if (ctxt->replaceEntities == 0) {
    do {
      if (valueend <= pxVar8) goto LAB_00146620;
      xVar1 = *pxVar8;
      pxVar8 = pxVar8 + 1;
    } while (xVar1 != '&');
    pxVar8 = xmlExpandEntitiesInAttValue(ctxt,value,0);
    if (pxVar8 != (xmlChar *)0x0) {
      if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
        name = xmlBuildQName(localname,prefix,fn,0x32);
        if (name == (xmlChar *)0x0) {
          xmlCtxtErrMemory(ctxt);
        }
        else {
          (ctxt->vctxt).valid = 1;
          pxVar9 = xmlValidCtxtNormalizeAttributeValue
                             (&ctxt->vctxt,ctxt->myDoc,ctxt->node,name,pxVar8);
          if ((ctxt->vctxt).valid != 1) {
            ctxt->valid = 0;
          }
          if (name != localname && name != fn) {
            (*xmlFree)(name);
          }
          if (pxVar9 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar8);
            pxVar8 = pxVar9;
          }
        }
      }
      uVar5 = xmlValidateOneAttribute(&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)node,pxVar8);
      ctxt->valid = ctxt->valid & uVar5;
      goto LAB_0014666d;
    }
LAB_00146620:
    if (*valueend == '\0') {
      uVar5 = xmlValidateOneAttribute(&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)node,value);
      ctxt->valid = ctxt->valid & uVar5;
      return (xmlAttrPtr)node;
    }
  }
  pxVar8 = xmlStrndup(value,iVar3 - iVar10);
  if (pxVar8 == (xmlChar *)0x0) {
    xmlCtxtErrMemory(ctxt);
  }
  uVar5 = xmlValidateOneAttribute(&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)node,pxVar8);
  ctxt->valid = ctxt->valid & uVar5;
  if (pxVar8 == (xmlChar *)0x0) {
    return (xmlAttrPtr)node;
  }
LAB_0014666d:
  (*xmlFree)(pxVar8);
  return (xmlAttrPtr)node;
}

Assistant:

static xmlAttrPtr
xmlSAX2AttributeNs(xmlParserCtxtPtr ctxt,
                   const xmlChar * localname,
                   const xmlChar * prefix,
		   const xmlChar * value,
		   const xmlChar * valueend)
{
    xmlAttrPtr ret;
    xmlNsPtr namespace = NULL;
    xmlChar *dup = NULL;

    /*
     * Note: if prefix == NULL, the attribute is not in the default namespace
     */
    if (prefix != NULL) {
	namespace = xmlParserNsLookupSax(ctxt, prefix);
	if ((namespace == NULL) && (xmlStrEqual(prefix, BAD_CAST "xml"))) {
            int res;

	    res = xmlSearchNsSafe(ctxt->node, prefix, &namespace);
            if (res < 0)
                xmlSAX2ErrMemory(ctxt);
	}
    }

    /*
     * allocate the node
     */
    if (ctxt->freeAttrs != NULL) {
        ret = ctxt->freeAttrs;
	ctxt->freeAttrs = ret->next;
	ctxt->freeAttrsNr--;
    } else {
        ret = xmlMalloc(sizeof(*ret));
        if (ret == NULL) {
            xmlSAX2ErrMemory(ctxt);
            return(NULL);
        }
    }

    memset(ret, 0, sizeof(xmlAttr));
    ret->type = XML_ATTRIBUTE_NODE;

    /*
     * xmlParseBalancedChunkMemoryRecover had a bug that could result in
     * a mismatch between ctxt->node->doc and ctxt->myDoc. We use
     * ctxt->node->doc here, but we should somehow make sure that the
     * document pointers match.
     */

    /* assert(ctxt->node->doc == ctxt->myDoc); */

    ret->parent = ctxt->node;
    ret->doc = ctxt->node->doc;
    ret->ns = namespace;

    if (ctxt->dictNames) {
        ret->name = localname;
    } else {
        ret->name = xmlStrdup(localname);
        if (ret->name == NULL)
            xmlSAX2ErrMemory(ctxt);
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
        xmlRegisterNodeDefaultValue((xmlNodePtr)ret);

    if ((ctxt->replaceEntities == 0) && (!ctxt->html)) {
	xmlNodePtr tmp;

	/*
	 * We know that if there is an entity reference, then
	 * the string has been dup'ed and terminates with 0
	 * otherwise with ' or "
	 */
	if (*valueend != 0) {
	    tmp = xmlSAX2TextNode(ctxt, value, valueend - value);
	    ret->children = tmp;
	    ret->last = tmp;
	    if (tmp != NULL) {
		tmp->doc = ret->doc;
		tmp->parent = (xmlNodePtr) ret;
	    }
	} else if (valueend > value) {
            if (xmlNodeParseContent((xmlNodePtr) ret, value,
                                    valueend - value) < 0)
                xmlSAX2ErrMemory(ctxt);
	}
    } else if (value != NULL) {
	xmlNodePtr tmp;

	tmp = xmlSAX2TextNode(ctxt, value, valueend - value);
	ret->children = tmp;
	ret->last = tmp;
	if (tmp != NULL) {
	    tmp->doc = ret->doc;
	    tmp->parent = (xmlNodePtr) ret;
	}
    }

#ifdef LIBXML_VALID_ENABLED
    if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset) {
	/*
	 * If we don't substitute entities, the validation should be
	 * done on a value with replaced entities anyway.
	 */
        if (!ctxt->replaceEntities) {
	    dup = xmlSAX2DecodeAttrEntities(ctxt, value, valueend);
	    if (dup == NULL) {
	        if (*valueend == 0) {
		    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				    ctxt->myDoc, ctxt->node, ret, value);
		} else {
		    /*
		     * That should already be normalized.
		     * cheaper to finally allocate here than duplicate
		     * entry points in the full validation code
		     */
		    dup = xmlStrndup(value, valueend - value);
                    if (dup == NULL)
                        xmlSAX2ErrMemory(ctxt);

		    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				    ctxt->myDoc, ctxt->node, ret, dup);
		}
	    } else {
	        /*
		 * dup now contains a string of the flattened attribute
		 * content with entities substituted. Check if we need to
		 * apply an extra layer of normalization.
		 * It need to be done twice ... it's an extra burden related
		 * to the ability to keep references in attributes
		 */
		if (ctxt->attsSpecial != NULL) {
		    xmlChar *nvalnorm;
		    xmlChar fn[50];
		    xmlChar *fullname;

		    fullname = xmlBuildQName(localname, prefix, fn, 50);
                    if (fullname == NULL) {
                        xmlSAX2ErrMemory(ctxt);
                    } else {
			ctxt->vctxt.valid = 1;
		        nvalnorm = xmlValidCtxtNormalizeAttributeValue(
			                 &ctxt->vctxt, ctxt->myDoc,
					 ctxt->node, fullname, dup);
			if (ctxt->vctxt.valid != 1)
			    ctxt->valid = 0;

			if ((fullname != fn) && (fullname != localname))
			    xmlFree(fullname);
			if (nvalnorm != NULL) {
			    xmlFree(dup);
			    dup = nvalnorm;
			}
		    }
		}

		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
			        ctxt->myDoc, ctxt->node, ret, dup);
	    }
	} else {
	    /*
	     * if entities already have been substituted, then
	     * the attribute as passed is already normalized
	     */
	    dup = xmlStrndup(value, valueend - value);
            if (dup == NULL)
                xmlSAX2ErrMemory(ctxt);

	    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
	                             ctxt->myDoc, ctxt->node, ret, dup);
	}
    } else
#endif /* LIBXML_VALID_ENABLED */
           if (((ctxt->loadsubset & XML_SKIP_IDS) == 0) &&
               (ctxt->input->entity == NULL) &&
               /* Don't create IDs containing entity references */
               (ret->children != NULL) &&
               (ret->children->type == XML_TEXT_NODE) &&
               (ret->children->next == NULL)) {
        xmlChar *content = ret->children->content;
        /*
	 * when validating, the ID registration is done at the attribute
	 * validation level. Otherwise we have to do specific handling here.
	 */
        if ((prefix == ctxt->str_xml) &&
	           (localname[0] == 'i') && (localname[1] == 'd') &&
		   (localname[2] == 0)) {
	    /*
	     * Add the xml:id value
	     *
	     * Open issue: normalization of the value.
	     */
	    if (xmlValidateNCName(content, 1) != 0) {
	        xmlErrValid(ctxt, XML_DTD_XMLID_VALUE,
                            "xml:id : attribute value %s is not an NCName\n",
                            content, NULL);
	    }
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, content, ret);
	} else {
            int res = xmlIsID(ctxt->myDoc, ctxt->node, ret);

            if (res < 0)
                xmlCtxtErrMemory(ctxt);
            else if (res > 0)
                xmlAddID(&ctxt->vctxt, ctxt->myDoc, content, ret);
            else if (xmlIsRef(ctxt->myDoc, ctxt->node, ret))
                xmlAddRef(&ctxt->vctxt, ctxt->myDoc, content, ret);
	}
    }
    if (dup != NULL)
	xmlFree(dup);

    return(ret);
}